

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O2

void handle_result(uv_fs_t *req)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uStack_1e0;
  uv_fs_t stat_req;
  
  if (req->fs_type == UV_FS_COPYFILE) {
    if (req->result == 0) {
      iVar3 = uv_fs_stat(0,&stat_req,req->path,0);
      uVar2 = stat_req.statbuf.st_size;
      uVar1 = stat_req.statbuf.st_mode;
      if (iVar3 == 0) {
        uv_fs_req_cleanup(&stat_req);
        iVar3 = uv_fs_stat(0,&stat_req,"test_file_dst",0);
        if (iVar3 == 0) {
          if (stat_req.statbuf.st_size == uVar2) {
            if (stat_req.statbuf.st_mode == uVar1) {
              uv_fs_req_cleanup(&stat_req);
              uv_fs_req_cleanup(req);
              result_check_count = result_check_count + 1;
              return;
            }
            pcVar4 = "stat_req.statbuf.st_mode == mode";
            uStack_1e0 = 0x3f;
          }
          else {
            pcVar4 = "stat_req.statbuf.st_size == size";
            uStack_1e0 = 0x3e;
          }
        }
        else {
          pcVar4 = "r == 0";
          uStack_1e0 = 0x3d;
        }
      }
      else {
        pcVar4 = "r == 0";
        uStack_1e0 = 0x38;
      }
    }
    else {
      pcVar4 = "req->result == 0";
      uStack_1e0 = 0x34;
    }
  }
  else {
    pcVar4 = "req->fs_type == UV_FS_COPYFILE";
    uStack_1e0 = 0x33;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
          ,uStack_1e0,pcVar4);
  abort();
}

Assistant:

static void handle_result(uv_fs_t* req) {
  uv_fs_t stat_req;
  uint64_t size;
  uint64_t mode;
  int r;

  ASSERT(req->fs_type == UV_FS_COPYFILE);
  ASSERT(req->result == 0);

  /* Verify that the file size and mode are the same. */
  r = uv_fs_stat(NULL, &stat_req, req->path, NULL);
  ASSERT(r == 0);
  size = stat_req.statbuf.st_size;
  mode = stat_req.statbuf.st_mode;
  uv_fs_req_cleanup(&stat_req);
  r = uv_fs_stat(NULL, &stat_req, dst, NULL);
  ASSERT(r == 0);
  ASSERT(stat_req.statbuf.st_size == size);
  ASSERT(stat_req.statbuf.st_mode == mode);
  uv_fs_req_cleanup(&stat_req);
  uv_fs_req_cleanup(req);
  result_check_count++;
}